

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-interleave.cc
# Opt level: O0

void util_bits::DeinterleaveUint32(uint64 code,uint32 *val0,uint32 *val1)

{
  uint32 *val1_local;
  uint32 *val0_local;
  uint64 code_local;
  
  *val0 = (uint)(byte)kDeinterleaveLut[code & 0x55] |
          (uint)(byte)kDeinterleaveLut[code >> 8 & 0x55] << 4 |
          (uint)(byte)kDeinterleaveLut[code >> 0x10 & 0x55] << 8 |
          (uint)(byte)kDeinterleaveLut[code >> 0x18 & 0x55] << 0xc |
          (uint)(byte)kDeinterleaveLut[code >> 0x20 & 0x55] << 0x10 |
          (uint)(byte)kDeinterleaveLut[code >> 0x28 & 0x55] << 0x14 |
          (uint)(byte)kDeinterleaveLut[code >> 0x30 & 0x55] << 0x18 |
          (uint)(byte)kDeinterleaveLut[code >> 0x38 & 0x55] << 0x1c;
  *val1 = (uint)(byte)kDeinterleaveLut[code & 0xaa] |
          (uint)(byte)kDeinterleaveLut[code >> 8 & 0xaa] << 4 |
          (uint)(byte)kDeinterleaveLut[code >> 0x10 & 0xaa] << 8 |
          (uint)(byte)kDeinterleaveLut[code >> 0x18 & 0xaa] << 0xc |
          (uint)(byte)kDeinterleaveLut[code >> 0x20 & 0xaa] << 0x10 |
          (uint)(byte)kDeinterleaveLut[code >> 0x28 & 0xaa] << 0x14 |
          (uint)(byte)kDeinterleaveLut[code >> 0x30 & 0xaa] << 0x18 |
          (uint)(byte)kDeinterleaveLut[code >> 0x38 & 0xaa] << 0x1c;
  return;
}

Assistant:

void DeinterleaveUint32(uint64 code, uint32 *val0, uint32 *val1) {
  *val0 = ((kDeinterleaveLut[code & 0x55]) |
           (kDeinterleaveLut[(code >> 8) & 0x55] << 4) |
           (kDeinterleaveLut[(code >> 16) & 0x55] << 8) |
           (kDeinterleaveLut[(code >> 24) & 0x55] << 12) |
           (kDeinterleaveLut[(code >> 32) & 0x55] << 16) |
           (kDeinterleaveLut[(code >> 40) & 0x55] << 20) |
           (kDeinterleaveLut[(code >> 48) & 0x55] << 24) |
           (kDeinterleaveLut[(code >> 56) & 0x55] << 28));
  *val1 = ((kDeinterleaveLut[code & 0xaa]) |
           (kDeinterleaveLut[(code >> 8) & 0xaa] << 4) |
           (kDeinterleaveLut[(code >> 16) & 0xaa] << 8) |
           (kDeinterleaveLut[(code >> 24) & 0xaa] << 12) |
           (kDeinterleaveLut[(code >> 32) & 0xaa] << 16) |
           (kDeinterleaveLut[(code >> 40) & 0xaa] << 20) |
           (kDeinterleaveLut[(code >> 48) & 0xaa] << 24) |
           (kDeinterleaveLut[(code >> 56) & 0xaa] << 28));
}